

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_> * __thiscall
wallet::LegacyScriptPubKeyMan::GetKeys(LegacyScriptPubKeyMan *this)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  char *in_RSI;
  set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_> *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<CKeyID>,_bool> pVar4;
  pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *mi;
  CryptedKeyMap *__range1;
  set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_> *set_address;
  const_iterator __end1;
  const_iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock48;
  set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  _Rb_tree_const_iterator<CKeyID> in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff90;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff98;
  FillableSigningProvider *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff58);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),in_RSI,
             (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  bVar2 = (**(code **)(**(long **)(in_RSI + 8) + 0x48))();
  if ((bVar2 & 1) == 0) {
    FillableSigningProvider::GetKeys(in_stack_ffffffffffffffb0);
  }
  else {
    std::set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_>::set(in_stack_ffffffffffffff58);
    std::
    map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
    ::begin((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    std::
    map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
    ::end((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
           *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    while (bVar3 = std::operator==((_Self *)in_stack_ffffffffffffff68._M_node,
                                   (_Self *)CONCAT17(in_stack_ffffffffffffff67,
                                                     in_stack_ffffffffffffff60)),
          ((bVar3 ^ 0xffU) & 1) != 0) {
      std::
      _Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::operator*((_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   *)in_stack_ffffffffffffff58);
      pVar4 = std::set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_>::insert
                        ((set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_> *)
                         in_stack_ffffffffffffff68._M_node,
                         (value_type *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60)
                        );
      in_stack_ffffffffffffff68 = pVar4.first._M_node;
      in_stack_ffffffffffffff67 = pVar4.second;
      std::
      _Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)in_stack_ffffffffffffff58);
    }
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::set<CKeyID> LegacyScriptPubKeyMan::GetKeys() const
{
    LOCK(cs_KeyStore);
    if (!m_storage.HasEncryptionKeys()) {
        return FillableSigningProvider::GetKeys();
    }
    std::set<CKeyID> set_address;
    for (const auto& mi : mapCryptedKeys) {
        set_address.insert(mi.first);
    }
    return set_address;
}